

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_polycurve.cpp
# Opt level: O3

bool __thiscall
ON_PolyCurve::GetNextDiscontinuity
          (ON_PolyCurve *this,continuity c,double t0,double t1,double *t,int *hint,int *dtype,
          double cos_angle_tolerance,double curvature_tolerance)

{
  uint uVar1;
  ON_Object *p;
  ON_Object *p_00;
  undefined1 auVar2 [16];
  double dVar3;
  ON_3dVector Km_00;
  ON_3dVector Km_01;
  ON_3dVector Kp_00;
  ON_3dVector Kp_01;
  bool bVar4;
  bool bVar5;
  continuity cVar6;
  uint uVar7;
  int iVar8;
  double *pdVar9;
  ON_ArcCurve *pOVar10;
  ON_ArcCurve *pOVar11;
  double *knot;
  ON_Curve *seg1;
  ON_Object *this_00;
  uint uVar12;
  int iVar13;
  ulong uVar14;
  ulong uVar15;
  undefined4 uVar16;
  undefined4 uVar17;
  undefined4 in_XMM0_Dc;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dc_00;
  undefined4 extraout_XMM0_Dc_01;
  undefined4 in_XMM0_Dd;
  undefined4 extraout_XMM0_Dd;
  undefined4 extraout_XMM0_Dd_00;
  undefined4 extraout_XMM0_Dd_01;
  double dVar18;
  undefined4 in_XMM1_Dc;
  undefined4 in_XMM1_Dd;
  undefined8 uVar19;
  double dVar20;
  double dVar21;
  double s;
  ON_3dVector D1p;
  ON_3dVector D1m;
  ON_3dVector Kp;
  ON_3dVector Km;
  ON_3dVector Tp;
  ON_3dVector Tm;
  ON_Interval sdom;
  ON_3dVector D2p;
  ON_3dVector D2m;
  ON_3dPoint Pp;
  ON_3dPoint Pm;
  double local_1f8;
  int local_1f0;
  continuity local_1ec;
  undefined1 local_1e8 [16];
  ON_Interval local_1d0;
  ON_3dVector local_1c0;
  undefined1 local_1a8 [16];
  double local_198;
  ulong local_190;
  ON_3dVector local_188;
  ON_3dVector local_170;
  ON_3dVector local_158;
  ON_3dVector local_140;
  double local_128;
  undefined8 uStack_120;
  undefined1 local_118 [16];
  double local_108;
  undefined8 uStack_100;
  ON_3dVector local_f8;
  ON_3dVector local_d8;
  undefined1 local_b8 [16];
  ON_Interval local_a0;
  ON_3dVector local_90;
  ON_3dVector local_78;
  ON_3dPoint local_60;
  ON_3dPoint local_48;
  
  auVar2._8_4_ = in_XMM0_Dc;
  auVar2._0_8_ = t0;
  auVar2._12_4_ = in_XMM0_Dd;
  uVar19 = auVar2._8_8_;
  ON_Interval::ON_Interval(&local_a0);
  ON_Interval::ON_Interval(&local_1d0);
  uVar1 = (this->m_segment).super_ON_SimpleArray<ON_Curve_*>.m_count;
  if (dtype != (int *)0x0) {
    *dtype = 0;
  }
  uVar12 = 0;
  if (t0 == t1 || (int)uVar1 < 1) {
    return false;
  }
  local_1ec = c;
  cVar6 = ON::ParametricContinuity(c);
  if (hint != (int *)0x0) {
    uVar12 = *hint & 0x3fff;
  }
  if ((this->m_t).m_count < 1) {
    pdVar9 = (double *)0x0;
  }
  else {
    pdVar9 = (this->m_t).m_a;
  }
  uVar7 = ON_NurbsSpanIndex(2,uVar1 + 1,pdVar9,t0,(uint)(t0 <= t1) * 2 + -1,uVar12);
  iVar13 = 0;
  if ((hint != (int *)0x0) && (iVar13 = 0, uVar12 == uVar7)) {
    iVar13 = *hint >> 0xe;
  }
  pdVar9 = (this->m_t).m_a;
  dVar21 = pdVar9[(int)uVar7];
  dVar18 = pdVar9[(long)(int)uVar7 + 1];
  dVar20 = (ABS(dVar18 - dVar21) + ABS(dVar18) + ABS(dVar21)) * 1.490116119385e-08;
  if (dVar21 + dVar20 < dVar18 - dVar20) {
    if (t1 <= t0) {
      if ((((dVar21 < t0) && (t1 < dVar21)) && (0 < (int)uVar7)) && (ABS(t0 - dVar21) <= dVar20)) {
        uVar19 = 0;
        t0 = dVar21;
      }
    }
    else if (((t0 < dVar18) && (dVar18 < t1)) &&
            (((int)(uVar7 + 1) < (int)uVar1 && (ABS(t0 - dVar18) <= dVar20)))) {
      knot = (double *)0x0;
      if (0 < (this->m_t).m_count) {
        knot = pdVar9;
      }
      uVar7 = ON_NurbsSpanIndex(2,uVar1 + 1,knot,dVar18,1,uVar12);
      uVar19 = 0;
      t0 = dVar18;
    }
  }
  if (uVar7 < uVar1) {
    dVar21 = t1;
    if (t0 <= t1) {
      dVar21 = t0;
    }
    pdVar9 = (this->m_t).m_a;
    if (dVar21 < pdVar9[(ulong)uVar7 + 1]) {
      local_1f0 = (uint)(t0 <= t1) * 2;
      local_190 = (ulong)(local_1f0 - 1);
      local_108 = t0;
      if (t0 <= t1) {
        local_108 = t1;
      }
      local_128 = (ABS(t0 - t1) + ABS(t1) + ABS(t0)) * 2.3283064365386963e-10;
      dVar18 = dVar21 + local_128;
      local_118._8_4_ = in_XMM1_Dc;
      local_118._0_8_ = dVar18;
      local_118._12_4_ = in_XMM1_Dd;
      local_128 = local_108 - local_128;
      uVar14 = (ulong)uVar7 + 1;
      bVar4 = false;
      uStack_120 = uVar19;
      uStack_100 = uVar19;
      do {
        uVar15 = (ulong)uVar7;
        if ((local_108 < pdVar9[uVar15] || local_108 == pdVar9[uVar15]) ||
           (p = (ON_Object *)(this->m_segment).super_ON_SimpleArray<ON_Curve_*>.m_a[uVar15],
           p == (ON_Object *)0x0)) break;
        (*p->_vptr_ON_Object[0x25])(p);
        pdVar9 = (this->m_t).m_a;
        local_1d0.m_t[1] = dVar18;
        ON_Interval::Set(&local_a0,pdVar9[uVar15],pdVar9[uVar14]);
        dVar18 = ON_Interval::TransformParameterTo(&local_a0,&local_1d0,t0);
        local_1e8._8_4_ = extraout_XMM0_Dc;
        local_1e8._0_8_ = dVar18;
        local_1e8._12_4_ = extraout_XMM0_Dd;
        dVar18 = ON_Interval::TransformParameterTo(&local_a0,&local_1d0,t1);
        uVar16 = SUB84(dVar18,0);
        uVar17 = (undefined4)((ulong)dVar18 >> 0x20);
        local_1a8._8_4_ = extraout_XMM0_Dc_00;
        local_1a8._0_8_ = dVar18;
        local_1a8._12_4_ = extraout_XMM0_Dd_00;
        iVar8 = (*p->_vptr_ON_Object[0x36])
                          (local_1e8._0_4_,uVar16,cos_angle_tolerance,curvature_tolerance,p,
                           (ulong)cVar6,&local_1f8);
        dVar18 = (double)CONCAT44(uVar17,uVar16);
        if ((char)iVar8 != '\0') {
          bVar4 = ON_Interval::operator==(&local_a0,&local_1d0);
          dVar18 = local_1f8;
          if (bVar4) {
LAB_00588e96:
            if (t == (double *)0x0) {
              return true;
            }
            *t = dVar18;
            if (hint == (int *)0x0) {
              return true;
            }
            *hint = iVar13 << 0xe | uVar7;
            return true;
          }
          dVar18 = ON_Interval::TransformParameterTo(&local_1d0,&local_a0,local_1f8);
          if (((double)local_118._0_8_ < dVar18) && (dVar18 < local_128)) goto LAB_00588e96;
          local_198 = dVar18;
          dVar18 = ON_Interval::Length(&local_a0);
          local_b8._8_4_ = extraout_XMM0_Dc_01;
          local_b8._0_8_ = dVar18;
          local_b8._12_4_ = extraout_XMM0_Dd_01;
          dVar18 = ON_Interval::Length(&local_1d0);
          dVar18 = ABS((double)local_b8._0_8_ / dVar18);
          dVar20 = 1.0;
          if ((1.0 <= dVar18) && (dVar20 = dVar18, 1000.0 < dVar18)) {
            dVar20 = 1000.0;
          }
          dVar20 = (ABS((double)local_1e8._0_8_ - (double)local_1a8._0_8_) +
                   ABS((double)local_1a8._0_8_) + ABS((double)local_1e8._0_8_)) *
                   2.3283064365386963e-10 * dVar20;
          dVar18 = (double)local_1a8._0_8_;
          dVar3 = (double)local_1e8._0_8_;
          if (local_198 <= (double)local_118._0_8_) {
            if ((double)local_1e8._0_8_ <= (double)local_1a8._0_8_) {
              dVar3 = (double)local_1e8._0_8_ + dVar20;
            }
            else {
              dVar18 = (double)local_1a8._0_8_ + dVar20;
            }
          }
          uVar16 = SUB84(dVar3,0);
          if (local_128 <= local_198) {
            if (dVar3 <= dVar18) {
              dVar18 = dVar18 - dVar20;
            }
            else {
              uVar16 = SUB84(dVar3 - dVar20,0);
            }
          }
          iVar8 = (*p->_vptr_ON_Object[0x36])
                            (uVar16,SUB84(dVar18,0),cos_angle_tolerance,curvature_tolerance,p,
                             (ulong)cVar6,&local_1f8);
          if ((((char)iVar8 != '\0') &&
              (dVar18 = ON_Interval::TransformParameterTo(&local_1d0,&local_a0,local_1f8),
              dVar21 < dVar18)) && (dVar18 < local_108)) goto LAB_00588e96;
        }
        uVar12 = uVar7 + (int)local_190;
        if (uVar1 <= uVar12) goto LAB_00588deb;
        p_00 = (ON_Object *)(this->m_segment).super_ON_SimpleArray<ON_Curve_*>.m_a[uVar12];
        if (p_00 == (ON_Object *)0x0) {
LAB_00588e8e:
          bVar4 = false;
          break;
        }
        if (t1 < t0) {
          bVar4 = false;
          pdVar9 = ON_Interval::operator[](&local_a0,0);
          if (*pdVar9 <= t1) break;
          pdVar9 = ON_Interval::operator[](&local_1d0,0);
          local_1e8._0_8_ = *pdVar9;
          (*p_00->_vptr_ON_Object[0x25])(p_00);
          iVar8 = 1;
          local_1c0.y = dVar18;
          pdVar9 = ON_Interval::operator[]((ON_Interval *)&local_1c0,1);
          uVar16 = SUB84(*pdVar9,0);
          uVar17 = (undefined4)((ulong)*pdVar9 >> 0x20);
        }
        else {
          pdVar9 = ON_Interval::operator[](&local_a0,1);
          if (t1 <= *pdVar9) goto LAB_00588e8e;
          pdVar9 = ON_Interval::operator[](&local_1d0,1);
          local_1e8._0_8_ = *pdVar9;
          (*p_00->_vptr_ON_Object[0x25])(p_00);
          local_1c0.y = dVar18;
          pdVar9 = ON_Interval::operator[]((ON_Interval *)&local_1c0,0);
          uVar16 = SUB84(*pdVar9,0);
          uVar17 = (undefined4)((ulong)*pdVar9 >> 0x20);
          iVar8 = -1;
        }
        auVar2 = local_1a8;
        bVar4 = false;
        if (Gsmooth_continuous < cVar6) goto LAB_00588dc0;
        local_1a8._4_4_ = uVar17;
        local_1a8._0_4_ = uVar16;
        local_1a8._8_8_ = auVar2._8_8_;
        if ((0x1028U >> (cVar6 & 0x1f) & 1) != 0) {
          ON_Curve::Ev2Der((ON_Curve *)p,(double)local_1e8._0_8_,&local_48,&local_170,&local_78,
                           iVar8,(int *)0x0);
          ON_Curve::Ev2Der((ON_Curve *)p_00,(double)local_1a8._0_8_,&local_60,&local_188,&local_90,
                           -iVar8,(int *)0x0);
          if (cVar6 == C2_continuous) {
            ON_3dVector::operator-(&local_1c0,&local_170,&local_188);
            dVar18 = ON_3dVector::MaximumCoordinate(&local_170);
            uVar16 = 0x2c4;
            uVar17 = 0x3e500000;
            bVar4 = ON_3dVector::IsTiny(&local_1c0,dVar18 * 1.490116119385e-08);
            if (!bVar4) {
LAB_00588ecc:
              iVar13 = 1;
              goto LAB_00588ed8;
            }
            ON_3dVector::operator-(&local_1c0,&local_78,&local_90);
            dVar18 = ON_3dVector::MaximumCoordinate(&local_78);
            bVar4 = ON_3dVector::IsTiny(&local_1c0,dVar18 * 1.490116119385e-08);
            dVar18 = (double)CONCAT44(uVar17,uVar16);
            if (bVar4 || dtype == (int *)0x0) {
              bVar4 = !bVar4;
              goto LAB_00588d5e;
            }
            iVar13 = 2;
LAB_00588ef0:
            *dtype = iVar13;
          }
          else {
            ON_EvCurvature(&local_170,&local_78,&local_d8,&local_140);
            ON_EvCurvature(&local_188,&local_90,&local_f8,&local_158);
            dVar18 = ON_3dVector::operator*(&local_d8,&local_f8);
            if (dVar18 < cos_angle_tolerance) goto LAB_00588ecc;
            if (cVar6 == Gsmooth_continuous) {
              Km_00.y = local_140.y;
              Km_00.x = local_140.x;
              Km_00.z = local_140.z;
              Kp_00.y = local_158.y;
              Kp_00.x = local_158.x;
              Kp_00.z = local_158.z;
              bVar4 = ON_IsGsmoothCurvatureContinuous
                                (Km_00,Kp_00,cos_angle_tolerance,curvature_tolerance);
              if ((bVar4) &&
                 (((pOVar10 = ON_ArcCurve::Cast(p), pOVar10 == (ON_ArcCurve *)0x0 ||
                   (pOVar11 = ON_ArcCurve::Cast(p_00), pOVar11 == (ON_ArcCurve *)0x0)) ||
                  (bVar4 = ON_ArcToArcTransitionIsNotGsmooth
                                     (&pOVar10->m_arc,&pOVar11->m_arc,cos_angle_tolerance,
                                      curvature_tolerance), !bVar4)))) {
                this_00 = p;
                if (t0 <= t1) {
                  this_00 = p_00;
                  p_00 = p;
                }
                bVar4 = ON_Curve::LastSpanIsLinear((ON_Curve *)p_00,1e-08,1e-08);
                uVar16 = 0xe2308c3a;
                uVar17 = 0x3e45798e;
                bVar5 = ON_Curve::FirstSpanIsLinear((ON_Curve *)this_00,1e-08,1e-08);
                dVar18 = (double)CONCAT44(uVar17,uVar16);
                bVar4 = bVar5 != bVar4;
                if ((dtype != (int *)0x0) && (bVar4)) {
                  iVar13 = 3;
                  goto LAB_00588ef0;
                }
                goto LAB_00588d5e;
              }
            }
            else {
              Km_01.y = local_140.y;
              Km_01.x = local_140.x;
              Km_01.z = local_140.z;
              Kp_01.y = local_158.y;
              Kp_01.x = local_158.x;
              Kp_01.z = local_158.z;
              dVar18 = curvature_tolerance;
              bVar4 = ON_IsG2CurvatureContinuous
                                (Km_01,Kp_01,cos_angle_tolerance,curvature_tolerance);
              if (bVar4) goto LAB_00588db4;
            }
            iVar13 = 2;
LAB_00588ed8:
            if (dtype != (int *)0x0) goto LAB_00588ef0;
          }
          bVar4 = true;
LAB_00588ef5:
          uVar14 = (ulong)(uVar7 + 1);
          if (t1 < t0) {
            uVar14 = uVar15;
          }
          if (t != (double *)0x0) {
            *t = (this->m_t).m_a[uVar14];
          }
          if (hint != (int *)0x0) {
            *hint = (int)uVar14;
          }
          break;
        }
        if ((0x14U >> (cVar6 & 0x1f) & 1) != 0) {
          ON_Curve::Ev1Der((ON_Curve *)p,(double)local_1e8._0_8_,&local_48,&local_170,iVar8,
                           (int *)0x0);
          ON_Curve::Ev1Der((ON_Curve *)p_00,(double)local_1a8._0_8_,&local_60,&local_188,-iVar8,
                           (int *)0x0);
          if (cVar6 == C1_continuous) {
            ON_3dVector::operator-(&local_1c0,&local_170,&local_188);
            dVar20 = ON_3dVector::MaximumCoordinate(&local_170);
            bVar4 = ON_3dVector::IsTiny(&local_1c0,dVar20 * 1.490116119385e-08);
            bVar4 = !bVar4;
          }
          else {
            local_d8.z = local_170.z;
            local_d8.x = local_170.x;
            local_d8.y = local_170.y;
            local_f8.x = local_188.x;
            local_f8.y = local_188.y;
            local_f8.z = local_188.z;
            ON_3dVector::Unitize(&local_d8);
            ON_3dVector::Unitize(&local_f8);
            dVar20 = ON_3dVector::operator*(&local_d8,&local_f8);
            bVar4 = true;
            dVar18 = cos_angle_tolerance;
            if (cos_angle_tolerance <= dVar20) {
LAB_00588db4:
              bVar4 = false;
              goto LAB_00588dc0;
            }
          }
          if ((dtype != (int *)0x0) && (bVar4)) {
            *dtype = 1;
          }
LAB_00588d5e:
          if (bVar4 != false) goto LAB_00588ef5;
        }
LAB_00588dc0:
        uVar14 = (ulong)(uVar7 + local_1f0);
        pdVar9 = (this->m_t).m_a;
        uVar7 = uVar12;
      } while (dVar21 < pdVar9[uVar14]);
      goto LAB_00588dee;
    }
  }
LAB_00588deb:
  bVar4 = false;
LAB_00588dee:
  if ((cVar6 != local_1ec) && (!bVar4)) {
    bVar4 = ON_Curve::GetNextDiscontinuity
                      (&this->super_ON_Curve,local_1ec,t0,t1,t,(int *)0x0,dtype,cos_angle_tolerance,
                       curvature_tolerance);
  }
  return bVar4;
}

Assistant:

bool ON_PolyCurve::GetNextDiscontinuity( 
        ON::continuity c,
        double t0,
        double t1,
        double* t,
        int* hint,
        int* dtype,
        double cos_angle_tolerance,
        double curvature_tolerance
        ) const
{
  ON_3dPoint Pm, Pp;
  ON_3dVector D1m, D1p, D2m, D2p, Tm, Tp, Km, Kp;
  double s0, s1, s;
  bool rc = false;
  ON_Interval sdom, cdom;
  const int count = Count();
  int segment_hint=0, curve_hint=0;
  if ( dtype )
    *dtype = 0;
  if ( count > 0 && t0 != t1 ) 
  {
    // 20 March 2003 Dale Lear:
    //     look for parametric discontinuities on the interior.
    //     If we don't find any, then well check for locus 
    //     discontinuities at the appropriate end
    ON::continuity input_c = c;
    c = ON::ParametricContinuity((int)c);

    segment_hint = (hint) ? (*hint & 0x3FFF) : 0;
    int segment_index = ON_NurbsSpanIndex(2,count+1,m_t,t0,(t0>t1)?-1:1,segment_hint);
    curve_hint = ( hint && segment_hint == segment_index ) ? ((*hint)>>14) : 0;


    {
      // 20 March 2003 Dale Lear:
      //     If t0 is very near interior m_t[] value, see if it
      //     should be set to that value.  A bit or two of 
      //     precision sometimes gets lost in proxy
      //     domain to real curve domain conversions on the interior
      //     of a curve domain.
      double segtol = (fabs(m_t[segment_index]) + fabs(m_t[segment_index+1]) + fabs(m_t[segment_index+1]-m_t[segment_index]))*ON_SQRT_EPSILON;
      if ( m_t[segment_index]+segtol < m_t[segment_index+1]-segtol )
      {
        if ( t0 < t1 )
        {
          if ( t0 < m_t[segment_index+1] && t1 > m_t[segment_index+1] && fabs(t0-m_t[segment_index+1]) <= segtol && segment_index+1 < count )
          {
            t0 = m_t[segment_index+1];
            segment_index = ON_NurbsSpanIndex(2,count+1,m_t,t0,1,segment_hint);
          }
        }
        else
        {
          if ( t0 > m_t[segment_index] && t1 < m_t[segment_index] && fabs(t0-m_t[segment_index]) <= segtol && segment_index > 0 )
          {
            t0 = m_t[segment_index];
          }
        }
      }
    }

    double tmin, tmax;
    int segment_index_delta;
    if (t0 > t1)
    {
      segment_index_delta = -1;
      tmin = t1;
      tmax = t0;
    }
    else
    {
      segment_index_delta = 1;
      tmin = t0;
      tmax = t1;
    }

    const ON_Curve* crv;
    for ( /*empty*/; 
              segment_index >= 0 
           && segment_index < count
           && tmin < m_t[segment_index+1] && m_t[segment_index] < tmax; 
          segment_index += segment_index_delta )
    {
      crv = m_segment[segment_index];
      if ( !crv )
        break;
      
      cdom = crv->Domain();
      sdom.Set( m_t[segment_index], m_t[segment_index+1] );
      s0 = sdom.TransformParameterTo(cdom, t0);
      s1 = sdom.TransformParameterTo(cdom, t1);
      rc = crv->GetNextDiscontinuity( c, s0, s1, &s, &curve_hint, dtype, cos_angle_tolerance, curvature_tolerance );
      if ( rc )
      {
        double kink_t;
        if ( sdom == cdom )
        {
          kink_t = s;
        }
        else
        {
          kink_t = cdom.TransformParameterTo(sdom, s);
          double t_tol = (fabs(t0)+fabs(t1)+fabs(t0-t1))*ON_ZERO_TOLERANCE;
          if ( kink_t <= tmin+t_tol || kink_t >= tmax-t_tol)
          {
            // 24 January 2002 Dale Lear -
            // It is possible that lost precision in the 
            // domain conversion is giving us trouble.
            // In particular, if this code is not here,
            // "t0" is right at a kink, and s0 gets bumped
            // down a little bit due to rounding/truncation,
            // we end up finding the kink at "t0" that we were
            // supposed to skip.
            double e = fabs(sdom.Length()/cdom.Length());
            if ( e < 1.0 ) e = 1.0; else if (e > 1000.0) e = 1000.0;
            double s_tol = (fabs(s0)+fabs(s1)+fabs(s0-s1))*ON_ZERO_TOLERANCE*e;
            if ( kink_t <= tmin+t_tol )
            {
              if( s0>s1 )
                s1 = s1 + s_tol;
              else
                s0 = s0 + s_tol;
            }
            if ( kink_t >= tmax-t_tol )
            {
              if ( s0>s1 )
                s0 = s0 - s_tol;
              else
                s1 = s1 - s_tol;
            }
            rc = crv->GetNextDiscontinuity( c, s0, s1, &s, &curve_hint, dtype, cos_angle_tolerance, curvature_tolerance );
            if (rc)
            {
              kink_t = cdom.TransformParameterTo(sdom, s);
              if ( kink_t <= tmin || kink_t >= tmax )
                rc = false;
            }
          }
        }

        if (rc)
        {
          if ( t )
          {
            *t = kink_t;
            if ( hint )
            {
              *hint = segment_index | (curve_hint<<14);
            }
          }
          break;
        }
      }


      // check for discontinuity between curve segments
      int next_segment_index = segment_index+segment_index_delta;
      if ( next_segment_index < 0 || next_segment_index >= count )
      {
        // no more curve segments in search interval
        break;
      }
      const ON_Curve* crv1 = m_segment[next_segment_index];
      if ( !crv1 )
        break;

      if ( t0 > t1 )
      {
        if ( sdom[0] <= t1 ) // this line is correct - search is decreasing towards t1
        {
          // INTERIOR of search interval does not include 
          // start this crv = end of next curve
          break;
        }
      }
      else
      {
        if ( t1 <= sdom[1] )
        {
          // INTERIOR of search interval does not include 
          // end of this crv = start of next curve
          break;
        }
      }

      double crv0_t, crv1_t;
      int crv0_side;
      if ( t0 > t1 )
      {
        // compare start if this curve against end of next curve
        crv0_t = cdom[0];
        crv1_t = crv1->Domain()[1];
        crv0_side = 1;
      }
      else
      {
        // compare end if this curve against start of next curve
        crv0_t = cdom[1];
        crv1_t = crv1->Domain()[0];
        crv0_side = -1;
      }

      switch( c )
      {
      case ON::continuity::C1_continuous:
      case ON::continuity::G1_continuous:
        crv->Ev1Der( crv0_t, Pm, D1m, crv0_side );   // point on this curve
        crv1->Ev1Der( crv1_t, Pp, D1p, -crv0_side ); // corresponding point on next curve
        if ( c == ON::continuity::C1_continuous )
        {
          if ( !(D1m-D1p).IsTiny(D1m.MaximumCoordinate()*ON_SQRT_EPSILON) )
            rc = true;
        }
        else
        {
          Tm = D1m;
          Tp = D1p;
          Tm.Unitize();
          Tp.Unitize();
          if ( Tm*Tp < cos_angle_tolerance )
            rc = true;
        }
        if ( rc && dtype )
          *dtype = 1;
        break;

      case ON::continuity::C2_continuous:
      case ON::continuity::G2_continuous:
      case ON::continuity::Gsmooth_continuous:
        crv->Ev2Der( crv0_t, Pm, D1m, D2m, crv0_side );   // point on this curve
        crv1->Ev2Der( crv1_t, Pp, D1p, D2p, -crv0_side ); // corresponding point on next curve
        if ( c == ON::continuity::C2_continuous )
        {
          if ( !(D1m-D1p).IsTiny(D1m.MaximumCoordinate()*ON_SQRT_EPSILON) ) 
          {
            rc = true;
            if ( dtype )
              *dtype = 1;
          }
          else if ( !(D2m-D2p).IsTiny(D2m.MaximumCoordinate()*ON_SQRT_EPSILON) )
          {
            rc = true;
            if ( dtype )
              *dtype = 2;
          }
        }
        else
        {
          ON_EvCurvature( D1m, D2m, Tm, Km );
          ON_EvCurvature( D1p, D2p, Tp, Kp );
          if ( Tm*Tp < cos_angle_tolerance )
          {
            rc = true;
            if ( dtype )
              *dtype = 1;
          }
          else 
          {
            bool bIsCurvatureContinuous = ( ON::continuity::Gsmooth_continuous == c )
              ? ON_IsGsmoothCurvatureContinuous(Km, Kp, cos_angle_tolerance, curvature_tolerance)
              : ON_IsG2CurvatureContinuous(Km, Kp, cos_angle_tolerance, curvature_tolerance);
            if ( bIsCurvatureContinuous &&  ON::continuity::Gsmooth_continuous == c )
            {
              // This fixex http://dev.mcneel.com/bugtrack/?q=116273
              const ON_ArcCurve* arc0 = ON_ArcCurve::Cast(crv);
              if ( 0 != arc0 )
              {
                const ON_ArcCurve* arc1 = ON_ArcCurve::Cast(crv1);
                if ( 0 != arc1 )
                {
                  // 6 November, 2012 Dale Lear
                  //   Fix bug 116273
                  //   by breaking when adjacent, tangent coplanar arcs
                  //   are visually different.
                  if ( ON_ArcToArcTransitionIsNotGsmooth(arc0->m_arc,arc1->m_arc, cos_angle_tolerance, curvature_tolerance ) )
                    bIsCurvatureContinuous = false;
                }
              }
            }
            if ( !bIsCurvatureContinuous )
            {
              // NOTE:
              //   The test to enter this scope must exactly match
              //   the one used in ON_NurbsCurve::GetNextDiscontinuity().
              rc = true;
              if ( dtype )
                *dtype = 2;
            }
            else if ( ON::continuity::Gsmooth_continuous == c )
            {
              const double is_linear_tolerance = 1.0e-8;  
              const double is_linear_min_length = 1.0e-8;
              const ON_Curve* seg0;
              const ON_Curve* seg1;
              if (crv0_side<0)
              {
                seg0 = crv;
                seg1 = crv1;
              }
              else
              {
                seg0 = crv1;
                seg1 = crv;
              }
              bool b0 = seg0->LastSpanIsLinear(is_linear_min_length,is_linear_tolerance);
              bool b1 = seg1->FirstSpanIsLinear(is_linear_min_length,is_linear_tolerance);
              if ( b0 != b1 )
              {
                rc = true;
                if ( dtype )
                  *dtype = 3;
              }
            }
          }
        }
        break;
      default:
        // intentionally ignoring other ON::continuity enum values
        break;
      }
      if (rc)
      {
        int tindex = (t0>t1)?segment_index:(segment_index+1); 
        if ( t )
          *t = m_t[tindex];
        if ( hint )
        {
          *hint = tindex;
        }
        break;
      }
    }

    if ( !rc && input_c != c )
    {
      // 20 March 2003 Dale Lear
      //   See if we need to do a locus check at an end
      rc = ON_Curve::GetNextDiscontinuity( input_c, 
                        t0, t1, t, nullptr, 
                        dtype, 
                        cos_angle_tolerance, curvature_tolerance );
    }
  }
  return rc;
}